

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

int init_tree(void)

{
  long lVar1;
  bool bVar2;
  
  for (lVar1 = 0; lVar1 != 0x800; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)symbol_node_array + lVar1) = 0;
  }
  adh_next_order = 0x201;
  bVar2 = adh_root_node != (adh_node_t *)0x0;
  if (bVar2) {
    perror("init_tree: root already initialized");
  }
  else {
    adh_nyt_node = create_nyt();
    adh_root_node = adh_nyt_node;
  }
  return (uint)bVar2;
}

Assistant:

int init_tree() {
#ifdef _DEBUG
    log_trace("adh_init_tree", "\n");
#endif

    for (int i = 0; i < MAX_CODE_BITS; ++i) {
        symbol_node_array[i] = NULL;
    }

    adh_next_order = MAX_ORDER;
    if(adh_root_node != NULL) {
        perror("init_tree: root already initialized");
        return RC_FAIL;
    }

    adh_nyt_node = adh_root_node = create_nyt();
    return RC_OK;
}